

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void cconv_substruct_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,int32_t *ip,CTInfo flags)

{
  CType *d_00;
  CTypeID1 CVar1;
  uint uVar2;
  CType *pCVar3;
  TValue *o;
  uint key;
  GCstr *key_00;
  CTypeID1 CVar4;
  bool bVar5;
  
  CVar4 = d->sib;
  do {
    do {
      while( true ) {
        if (CVar4 == 0) {
          return;
        }
        pCVar3 = cts->tab;
        d_00 = pCVar3 + CVar4;
        CVar1 = pCVar3[CVar4].sib;
        uVar2 = pCVar3[CVar4].info;
        CVar4 = CVar1;
        if ((uVar2 >> 0x1c) - 9 < 2) break;
        if ((uVar2 & 0xf0ff0000) == 0x80030000) {
          cconv_substruct_tab(cts,pCVar3 + (uVar2 & 0xffff),dp + d_00->size,t,ip,flags);
        }
      }
      key_00 = (GCstr *)(d_00->name).gcptr64;
    } while (key_00 == (GCstr *)0x0);
    uVar2 = *ip;
    key = uVar2;
    if (-1 < (int)uVar2) {
      do {
        if (key < t->asize) {
          o = (TValue *)((ulong)key * 8 + (t->array).ptr64);
        }
        else {
          o = lj_tab_getinth(t,key);
        }
        if ((o != (cTValue *)0x0) && (o->u64 != 0xffffffffffffffff)) {
          *ip = key + 1;
          goto LAB_00140cbd;
        }
        bVar5 = key == 0;
        key = 1;
      } while (bVar5);
      if (uVar2 != 0) {
        return;
      }
      *ip = -1;
      key_00 = (GCstr *)(d_00->name).gcptr64;
    }
    o = lj_tab_getstr(t,key_00);
    if ((o != (cTValue *)0x0) && (o->u64 != 0xffffffffffffffff)) {
LAB_00140cbd:
      if ((d_00->info & 0xf0000000) == 0x90000000) {
        lj_cconv_ct_tv(cts,cts->tab + (d_00->info & 0xffff),dp + d_00->size,o,flags);
      }
      else {
        lj_cconv_bf_tv(cts,d_00,dp + d_00->size,o);
      }
      if ((d->info & 0x800000) != 0) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void cconv_substruct_tab(CTState *cts, CType *d, uint8_t *dp,
				GCtab *t, int32_t *ip, CTInfo flags)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      TValue *tv;
      int32_t i = *ip, iz = i;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= 0) {
      retry:
	tv = (TValue *)lj_tab_getint(t, i);
	if (!tv || tvisnil(tv)) {
	  if (i == 0) { i = 1; goto retry; }  /* 1-based tables. */
	  if (iz == 0) { *ip = i = -1; goto tryname; }  /* Init named fields. */
	  break;  /* Stop at first nil. */
	}
	*ip = i + 1;
      } else {
      tryname:
	tv = (TValue *)lj_tab_getstr(t, gco2str(gcref(df->name)));
	if (!tv || tvisnil(tv)) continue;
      }
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, tv, flags);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, tv);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_tab(cts, ctype_rawchild(cts, df),
			  dp+df->size, t, ip, flags);
    }  /* Ignore all other entries in the chain. */
  }
}